

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_div_s_b_mips64el(CPUMIPSState_conflict10 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  byte bVar1;
  char cVar2;
  byte bVar3;
  byte bVar4;
  
  bVar1 = *(byte *)((env->active_fpu).fpr + ws);
  cVar2 = *(char *)((env->active_fpu).fpr + wt);
  bVar4 = 0x80;
  bVar3 = 0x80;
  if (cVar2 != -1 || bVar1 != 0x80) {
    if (cVar2 == '\0') {
      bVar3 = (char)~bVar1 >> 7 | 1;
    }
    else {
      bVar3 = (char)bVar1 / cVar2;
    }
  }
  *(byte *)((env->active_fpu).fpr + wd) = bVar3;
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 1);
  cVar2 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 1);
  if (cVar2 != -1 || bVar1 != 0x80) {
    if (cVar2 == '\0') {
      bVar4 = (char)~bVar1 >> 7 | 1;
    }
    else {
      bVar4 = (char)bVar1 / cVar2;
    }
  }
  *(byte *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 1) = bVar4;
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 2);
  cVar2 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 2);
  bVar4 = 0x80;
  bVar3 = 0x80;
  if (cVar2 != -1 || bVar1 != 0x80) {
    if (cVar2 == '\0') {
      bVar3 = (char)~bVar1 >> 7 | 1;
    }
    else {
      bVar3 = (char)bVar1 / cVar2;
    }
  }
  *(byte *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 2) = bVar3;
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 3);
  cVar2 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 3);
  if (cVar2 != -1 || bVar1 != 0x80) {
    if (cVar2 == '\0') {
      bVar4 = (char)~bVar1 >> 7 | 1;
    }
    else {
      bVar4 = (char)bVar1 / cVar2;
    }
  }
  *(byte *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 3) = bVar4;
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 4);
  cVar2 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 4);
  bVar4 = 0x80;
  bVar3 = 0x80;
  if (cVar2 != -1 || bVar1 != 0x80) {
    if (cVar2 == '\0') {
      bVar3 = (char)~bVar1 >> 7 | 1;
    }
    else {
      bVar3 = (char)bVar1 / cVar2;
    }
  }
  *(byte *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 4) = bVar3;
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 5);
  cVar2 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 5);
  if (cVar2 != -1 || bVar1 != 0x80) {
    if (cVar2 == '\0') {
      bVar4 = (char)~bVar1 >> 7 | 1;
    }
    else {
      bVar4 = (char)bVar1 / cVar2;
    }
  }
  *(byte *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 5) = bVar4;
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 6);
  cVar2 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 6);
  bVar4 = 0x80;
  bVar3 = 0x80;
  if (cVar2 != -1 || bVar1 != 0x80) {
    if (cVar2 == '\0') {
      bVar3 = (char)~bVar1 >> 7 | 1;
    }
    else {
      bVar3 = (char)bVar1 / cVar2;
    }
  }
  *(byte *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 6) = bVar3;
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 7);
  cVar2 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 7);
  if (cVar2 != -1 || bVar1 != 0x80) {
    if (cVar2 == '\0') {
      bVar4 = (char)~bVar1 >> 7 | 1;
    }
    else {
      bVar4 = (char)bVar1 / cVar2;
    }
  }
  *(byte *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 7) = bVar4;
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
  cVar2 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
  bVar4 = 0x80;
  bVar3 = 0x80;
  if (cVar2 != -1 || bVar1 != 0x80) {
    if (cVar2 == '\0') {
      bVar3 = (char)~bVar1 >> 7 | 1;
    }
    else {
      bVar3 = (char)bVar1 / cVar2;
    }
  }
  *(byte *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = bVar3;
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 9);
  cVar2 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 9);
  if (cVar2 != -1 || bVar1 != 0x80) {
    if (cVar2 == '\0') {
      bVar4 = (char)~bVar1 >> 7 | 1;
    }
    else {
      bVar4 = (char)bVar1 / cVar2;
    }
  }
  *(byte *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 9) = bVar4;
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 10);
  cVar2 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 10);
  bVar4 = 0x80;
  bVar3 = 0x80;
  if (cVar2 != -1 || bVar1 != 0x80) {
    if (cVar2 == '\0') {
      bVar3 = (char)~bVar1 >> 7 | 1;
    }
    else {
      bVar3 = (char)bVar1 / cVar2;
    }
  }
  *(byte *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 10) = bVar3;
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xb);
  cVar2 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xb);
  if (cVar2 != -1 || bVar1 != 0x80) {
    if (cVar2 == '\0') {
      bVar4 = (char)~bVar1 >> 7 | 1;
    }
    else {
      bVar4 = (char)bVar1 / cVar2;
    }
  }
  *(byte *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xb) = bVar4;
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xc);
  cVar2 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xc);
  bVar4 = 0x80;
  bVar3 = 0x80;
  if (cVar2 != -1 || bVar1 != 0x80) {
    if (cVar2 == '\0') {
      bVar3 = (char)~bVar1 >> 7 | 1;
    }
    else {
      bVar3 = (char)bVar1 / cVar2;
    }
  }
  *(byte *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xc) = bVar3;
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xd);
  cVar2 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xd);
  if (cVar2 != -1 || bVar1 != 0x80) {
    if (cVar2 == '\0') {
      bVar4 = (char)~bVar1 >> 7 | 1;
    }
    else {
      bVar4 = (char)bVar1 / cVar2;
    }
  }
  *(byte *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xd) = bVar4;
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xe);
  cVar2 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xe);
  bVar4 = 0x80;
  bVar3 = 0x80;
  if (cVar2 != -1 || bVar1 != 0x80) {
    if (cVar2 == '\0') {
      bVar3 = (char)~bVar1 >> 7 | 1;
    }
    else {
      bVar3 = (char)bVar1 / cVar2;
    }
  }
  *(byte *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xe) = bVar3;
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xf);
  cVar2 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xf);
  if (cVar2 != -1 || bVar1 != 0x80) {
    if (cVar2 == '\0') {
      bVar4 = (char)~bVar1 >> 7 | 1;
    }
    else {
      bVar4 = (char)bVar1 / cVar2;
    }
  }
  *(byte *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xf) = bVar4;
  return;
}

Assistant:

void helper_msa_div_s_b(CPUMIPSState *env,
                        uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->b[0]  = msa_div_s_df(DF_BYTE, pws->b[0],  pwt->b[0]);
    pwd->b[1]  = msa_div_s_df(DF_BYTE, pws->b[1],  pwt->b[1]);
    pwd->b[2]  = msa_div_s_df(DF_BYTE, pws->b[2],  pwt->b[2]);
    pwd->b[3]  = msa_div_s_df(DF_BYTE, pws->b[3],  pwt->b[3]);
    pwd->b[4]  = msa_div_s_df(DF_BYTE, pws->b[4],  pwt->b[4]);
    pwd->b[5]  = msa_div_s_df(DF_BYTE, pws->b[5],  pwt->b[5]);
    pwd->b[6]  = msa_div_s_df(DF_BYTE, pws->b[6],  pwt->b[6]);
    pwd->b[7]  = msa_div_s_df(DF_BYTE, pws->b[7],  pwt->b[7]);
    pwd->b[8]  = msa_div_s_df(DF_BYTE, pws->b[8],  pwt->b[8]);
    pwd->b[9]  = msa_div_s_df(DF_BYTE, pws->b[9],  pwt->b[9]);
    pwd->b[10] = msa_div_s_df(DF_BYTE, pws->b[10], pwt->b[10]);
    pwd->b[11] = msa_div_s_df(DF_BYTE, pws->b[11], pwt->b[11]);
    pwd->b[12] = msa_div_s_df(DF_BYTE, pws->b[12], pwt->b[12]);
    pwd->b[13] = msa_div_s_df(DF_BYTE, pws->b[13], pwt->b[13]);
    pwd->b[14] = msa_div_s_df(DF_BYTE, pws->b[14], pwt->b[14]);
    pwd->b[15] = msa_div_s_df(DF_BYTE, pws->b[15], pwt->b[15]);
}